

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.c
# Opt level: O0

axbStatus_t axbOpBackendRegisterDefaults(axbHandle_s *handle)

{
  uint uVar1;
  axbStatus_t status;
  axbHandle_s *handle_local;
  
  uVar1 = axbOpBackendRegister_Host(handle);
  if (uVar1 == 0) {
    uVar1 = axbOpBackendRegister_CUDA(handle);
    if (uVar1 == 0) {
      uVar1 = axbOpBackendRegister_OpenCL(handle);
      if ((uVar1 != 0) &&
         (fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/backend.c"
                  ,0xcb,(ulong)uVar1), uVar1 != 0)) {
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/backend.c"
                      ,0xcb,"axbStatus_t axbOpBackendRegisterDefaults(struct axbHandle_s *)");
      }
    }
    else {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/backend.c"
              ,0xca,(ulong)uVar1);
      if (uVar1 != 0) {
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/backend.c"
                      ,0xca,"axbStatus_t axbOpBackendRegisterDefaults(struct axbHandle_s *)");
      }
    }
  }
  else {
    fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/backend.c"
            ,0xc9,(ulong)uVar1);
    if (uVar1 != 0) {
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/backend.c"
                    ,0xc9,"axbStatus_t axbOpBackendRegisterDefaults(struct axbHandle_s *)");
    }
  }
  return 0;
}

Assistant:

axbStatus_t axbOpBackendRegisterDefaults(struct axbHandle_s *handle)
{
  axbStatus_t status;
  status = axbOpBackendRegister_Host(handle); AXB_ERRCHK(status);
  status = axbOpBackendRegister_CUDA(handle); AXB_ERRCHK(status);
  status = axbOpBackendRegister_OpenCL(handle); AXB_ERRCHK(status);
  return 0;
}